

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDelay.c
# Opt level: O2

int If_CutLutBalanceEval(If_Man_t *p,If_Cut_t *pCut)

{
  If_DsdMan_t *pIVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  If_Obj_t *pIVar5;
  char *pcVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  
  uVar8 = *(uint *)&pCut->field_0x1c;
  *(uint *)&pCut->field_0x1c = (uint)(0x1ffffff < uVar8) + (uVar8 & 0xffffd000) + 0x2000;
  pCut->uMaskFunc = 0;
  if (uVar8 < 0x1000000) {
    iVar2 = If_CutTruthLit(pCut);
    iVar2 = Abc_Lit2Var(iVar2);
    if (iVar2 == 0) {
      return 0;
    }
    __assert_fail("Abc_Lit2Var(If_CutTruthLit(pCut)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDelay.c"
                  ,0x178,"int If_CutLutBalanceEval(If_Man_t *, If_Cut_t *)");
  }
  if ((uVar8 & 0xff000000) == 0x1000000) {
    iVar2 = If_CutTruthLit(pCut);
    iVar2 = Abc_Lit2Var(iVar2);
    if (iVar2 == 1) {
      pIVar5 = If_CutLeaf(p,pCut,0);
      return (int)(pIVar5->CutBest).Delay;
    }
    __assert_fail("Abc_Lit2Var(If_CutTruthLit(pCut)) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDelay.c"
                  ,0x17d,"int If_CutLutBalanceEval(If_Man_t *, If_Cut_t *)");
  }
  pcVar6 = If_CutDsdPerm(p,pCut);
  iVar3 = (int)*p->pPars->pLutStruct;
  iVar2 = -1;
  uVar9 = 0;
  uVar11 = 0;
  iVar10 = 0;
  uVar8 = 0;
  while( true ) {
    uVar7 = *(uint *)&pCut->field_0x1c >> 0x18;
    if (uVar7 <= uVar11) break;
    iVar4 = Abc_Lit2Var((int)pcVar6[uVar11]);
    pIVar5 = If_CutLeaf(p,pCut,iVar4);
    iVar4 = (int)(pIVar5->CutBest).Delay;
    if (iVar2 < iVar4) {
      iVar10 = 1;
      uVar8 = 1 << ((byte)uVar9 & 0x1f);
      iVar2 = iVar4;
    }
    else if (iVar2 == iVar4) {
      iVar10 = iVar10 + 1;
      uVar8 = uVar8 | 1 << (uVar9 & 0x1f);
    }
    uVar11 = uVar11 + 1;
    uVar9 = uVar9 + 2;
  }
  iVar4 = iVar3 + -0x30;
  if (iVar4 < (int)uVar7) {
    *(uint *)&pCut->field_0x1c = *(uint *)&pCut->field_0x1c & 0xfffff000 | 2;
    if (iVar10 <= iVar3 + -0x31) {
      pIVar1 = p->pIfDsdMan;
      iVar10 = If_CutDsdLit(p,pCut);
      uVar8 = If_DsdManCheckXY(pIVar1,iVar10,iVar4,1,uVar8,0,0);
      pCut->uMaskFunc = uVar8;
      if (0 < (int)uVar8) goto LAB_0037f8ef;
    }
    pIVar1 = p->pIfDsdMan;
    iVar10 = If_CutDsdLit(p,pCut);
    uVar8 = If_DsdManCheckXY(pIVar1,iVar10,iVar4,1,0,0,0);
    pCut->uMaskFunc = uVar8;
    uVar8 = -(uint)(uVar8 == 0) | iVar2 + 2U;
  }
  else {
LAB_0037f8ef:
    uVar8 = iVar2 + 1;
  }
  return uVar8;
}

Assistant:

int If_CutLutBalanceEval( If_Man_t * p, If_Cut_t * pCut )
{
    pCut->fUser = 1;
    pCut->Cost = pCut->nLeaves > 1 ? 1 : 0;
    pCut->uMaskFunc = 0;
    if ( pCut->nLeaves == 0 ) // const
    {
        assert( Abc_Lit2Var(If_CutTruthLit(pCut)) == 0 );
        return 0;
    }
    if ( pCut->nLeaves == 1 ) // variable
    {
        assert( Abc_Lit2Var(If_CutTruthLit(pCut)) == 1 );
        return (int)If_ObjCutBest(If_CutLeaf(p, pCut, 0))->Delay;
    }
    else
    {
        char * pCutPerm = If_CutDsdPerm( p, pCut );
        int LutSize = p->pPars->pLutStruct[0] - '0';
        int i, pTimes[IF_MAX_FUNC_LUTSIZE];
        int DelayMax = -1, nLeafMax = 0;
        unsigned uLeafMask = 0;
        for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
        {
            pTimes[i] = (int)If_ObjCutBest(If_CutLeaf(p, pCut, Abc_Lit2Var((int)pCutPerm[i])))->Delay; 
            if ( DelayMax < pTimes[i] )
                DelayMax = pTimes[i], nLeafMax = 1, uLeafMask = (1 << (i << 1));
            else if ( DelayMax == pTimes[i] )
                nLeafMax++, uLeafMask |= (1 << (i << 1));
        }
        if ( If_CutLeaveNum(pCut) <= LutSize )
            return DelayMax + 1;
        pCut->Cost = 2;
        if ( nLeafMax <= LutSize - 1 )
        {
            pCut->uMaskFunc = If_DsdManCheckXY( p->pIfDsdMan, If_CutDsdLit(p, pCut), LutSize, 1, uLeafMask, 0, 0 );
            if ( pCut->uMaskFunc > 0 )
                return DelayMax + 1;
        }
        pCut->uMaskFunc = If_DsdManCheckXY( p->pIfDsdMan, If_CutDsdLit(p, pCut), LutSize, 1, 0, 0, 0 );
        if ( pCut->uMaskFunc == 0 )
            return -1;
        return DelayMax + 2;
    }
}